

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O0

void __thiscall RVO::KdTree::buildAgentTree(KdTree *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference __x;
  ulong local_18;
  size_t i;
  KdTree *this_local;
  
  sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
  sVar3 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->sim_->agents_);
  if (sVar2 < sVar3) {
    local_18 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    while( true ) {
      sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->sim_->agents_);
      if (sVar2 <= local_18) break;
      __x = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                      (&this->sim_->agents_,local_18);
      std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::push_back(&this->agents_,__x);
      local_18 = local_18 + 1;
    }
    sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::resize
              (&this->agentTree_,sVar2 * 2 - 1);
  }
  bVar1 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::empty(&this->agents_);
  if (!bVar1) {
    sVar2 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::size(&this->agents_);
    buildAgentTreeRecursive(this,0,sVar2,0);
  }
  return;
}

Assistant:

void KdTree::buildAgentTree()
	{
		if (agents_.size() < sim_->agents_.size()) {
			for (size_t i = agents_.size(); i < sim_->agents_.size(); ++i) {
				agents_.push_back(sim_->agents_[i]);
			}

			agentTree_.resize(2 * agents_.size() - 1);
		}

		if (!agents_.empty()) {
			buildAgentTreeRecursive(0, agents_.size(), 0);
		}
	}